

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgcnn(fitsfile *fptr,int casesen,char *templt,char *colname,int *colnum,int *status)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *in_RCX;
  undefined8 in_RDX;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  tcolumn *colptr;
  long ivalue;
  int unique;
  int exact;
  int match;
  int foundw;
  int founde;
  int ii;
  int tstatus;
  char errmsg [81];
  char *local_c8;
  long local_c0;
  int local_b0;
  int local_ac;
  int local_a0;
  int local_9c;
  char local_98 [48];
  int *in_stack_ffffffffffffff98;
  long *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  fitsfile *in_stack_ffffffffffffffb8;
  
  if (*in_R9 < 1) {
    *(undefined4 *)(*(long *)(in_RDI + 2) + 0x3b4) = 0;
    local_9c = 0;
  }
  else {
    if (*in_R9 != 0xed) {
      return *in_R9;
    }
    local_9c = 0xed;
    *in_R9 = 0;
  }
  *in_RCX = '\0';
  *in_R8 = 0;
  if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
       (iVar4 = ffrdef((fitsfile *)errmsg._24_8_,(int *)errmsg._16_8_), 0 < iVar4)) {
      return *in_R9;
    }
  }
  else {
    ffmahd(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
           (int *)in_stack_ffffffffffffffa0);
  }
  local_c8 = (char *)(*(long *)(*(long *)(in_RDI + 2) + 0x3d0) +
                     (long)*(int *)(*(long *)(in_RDI + 2) + 0x3b4) * 0xa0);
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_a0 = *(int *)(*(long *)(in_RDI + 2) + 0x3b4);
  do {
    if (*(int *)(*(long *)(in_RDI + 2) + 0x3b0) <= local_a0) {
      if (bVar1) {
        if (local_9c == 0xed) {
          *in_R9 = 0xed;
        }
      }
      else if (bVar2) {
        if ((!bVar3) || (local_9c == 0xed)) {
          *in_R9 = 0xed;
        }
      }
      else {
        ffc2ii((char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
              );
        if (((local_9c == 0) && (local_c0 <= *(int *)(*(long *)(in_RDI + 2) + 0x3b0))) &&
           (0 < local_c0)) {
          *in_R8 = (int)local_c0;
          strcpy(in_RCX,(char *)((local_c0 + -1) * 0xa0 + *(long *)(*(long *)(in_RDI + 2) + 0x3d0)))
          ;
        }
        else {
          *in_R9 = 0xdb;
          if (local_9c != 0xed) {
            snprintf(local_98,0x51,"ffgcnn could not find column: %.45s",in_RDX);
            ffpmsg((char *)0x15f703);
          }
        }
      }
      *(int *)(*(long *)(in_RDI + 2) + 0x3b4) = *in_R8;
      return *in_R9;
    }
    ffcmps(_foundw,_exact,unique,(int *)ivalue,(int *)colptr);
    if (local_ac != 0) {
      if ((bVar1) && (local_b0 != 0)) {
        *(int *)(*(long *)(in_RDI + 2) + 0x3b4) = *in_R8;
        *in_R9 = 0xed;
        return 0xed;
      }
      if (!bVar1) {
        if (local_b0 == 0) {
          bVar3 = !bVar2;
          if (bVar3) {
            strcpy(in_RCX,local_c8);
            *in_R8 = local_a0 + 1;
            *(int *)(*(long *)(in_RDI + 2) + 0x3b4) = *in_R8;
            bVar2 = true;
          }
        }
        else {
          strcpy(in_RCX,local_c8);
          *in_R8 = local_a0 + 1;
          bVar1 = true;
        }
      }
    }
    local_a0 = local_a0 + 1;
    local_c8 = local_c8 + 0xa0;
  } while( true );
}

Assistant:

int ffgcnn( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  casesen,    /* I - case sensitive string comparison? 0=no  */
            char *templt,    /* I - input name of column (w/wildcards)      */
            char *colname,   /* O - full column name up to 68 + 1 chars long*/
            int  *colnum,    /* O - number of the named column; 1=first col */
            int  *status)    /* IO - error status                           */
/*
  Return the full column name and column number of the next column whose
  TTYPEn keyword value matches the input template string.
  The template may contain the * and ? wildcards.  Status = 237 is
  returned if the match is not unique.  If so, one may call this routine
  again with input status=237  to get the next match.  A status value of
  219 is returned when there are no more matching columns.
*/
{
    char errmsg[FLEN_ERRMSG];
    int tstatus, ii, founde, foundw, match, exact, unique;
    long ivalue;
    tcolumn *colptr;

    if (*status <= 0)
    {
        (fptr->Fptr)->startcol = 0;   /* start search with first column */
        tstatus = 0;
    }
    else if (*status == COL_NOT_UNIQUE) /* start search from previous spot */
    {
        tstatus = COL_NOT_UNIQUE;
        *status = 0;
    }
    else
        return(*status);  /* bad input status value */

    colname[0] = 0;    /* initialize null return */
    *colnum = 0;

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)   /* rescan header to get col struct */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += ((fptr->Fptr)->startcol);      /* offset to starting column */

    founde = FALSE;   /* initialize 'found exact match' flag */
    foundw = FALSE;   /* initialize 'found wildcard match' flag */
    unique = FALSE;

    for (ii = (fptr->Fptr)->startcol; ii < (fptr->Fptr)->tfield; ii++, colptr++)
    {
        ffcmps(templt, colptr->ttype, casesen, &match, &exact);
        if (match)
        {
            if (founde && exact)
            {
                /* warning: this is the second exact match we've found     */
                /*reset pointer to first match so next search starts there */
               (fptr->Fptr)->startcol = *colnum;
               return(*status = COL_NOT_UNIQUE);
            }
            else if (founde)   /* a wildcard match */
            {
                /* already found exact match so ignore this non-exact match */
            }
            else if (exact)
            {
                /* this is the first exact match we have found, so save it. */
                strcpy(colname, colptr->ttype);
                *colnum = ii + 1;
                founde = TRUE;
            }
            else if (foundw)
            {
                /* we have already found a wild card match, so not unique */
                /* continue searching for other matches                   */
                unique = FALSE;
            }
            else
            {
               /* this is the first wild card match we've found. save it */
               strcpy(colname, colptr->ttype);
               *colnum = ii + 1;
               (fptr->Fptr)->startcol = *colnum;
               foundw = TRUE;
               unique = TRUE;
            }
        }
    }

    /* OK, we've checked all the names now see if we got any matches */
    if (founde)
    {
        if (tstatus == COL_NOT_UNIQUE)  /* we did find 1 exact match but */
            *status = COL_NOT_UNIQUE;   /* there was a previous match too */
    }
    else if (foundw)
    {
        /* found one or more wildcard matches; report error if not unique */
       if (!unique || tstatus == COL_NOT_UNIQUE)
           *status = COL_NOT_UNIQUE;
    }
    else
    {
        /* didn't find a match; check if template is a positive integer */
        ffc2ii(templt, &ivalue, &tstatus);
        if (tstatus ==  0 && ivalue <= (fptr->Fptr)->tfield && ivalue > 0)
        {
            *colnum = ivalue;

            colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
            colptr += (ivalue - 1);    /* offset to correct column */
            strcpy(colname, colptr->ttype);
        }
        else
        {
            *status = COL_NOT_FOUND;
            if (tstatus != COL_NOT_UNIQUE)
            {
              snprintf(errmsg, FLEN_ERRMSG, "ffgcnn could not find column: %.45s", templt);
              ffpmsg(errmsg);
            }
        }
    }
    
    (fptr->Fptr)->startcol = *colnum;  /* save pointer for next time */
    return(*status);
}